

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cfc8e::PeerManagerImpl::PushNodeVersion
          (PeerManagerImpl *this,CNode *pnode,Peer *peer)

{
  CConnman *this_00;
  string msg_type;
  bool bVar1;
  Level level;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  unsigned_long *args_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  SerParams *local_180;
  CService *local_178;
  allocator<char> local_16a;
  bool tx_relay;
  uint64_t your_services;
  NodeId nodeid;
  int nNodeStartingHeight;
  uint64_t nonce;
  int64_t nTime;
  uint64_t my_services;
  CService local_138;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100 [8];
  undefined8 uStack_f8;
  CService addr_you;
  CAddress addr;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [8];
  undefined8 uStack_78;
  CSerializedNetMsg local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  my_services = peer->m_our_services;
  nTime = (int64_t)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                             ();
  nonce = pnode->nLocalHostNonce;
  nNodeStartingHeight = (this->m_best_height).super___atomic_base<int>._M_i;
  nodeid = pnode->id;
  CAddress::CAddress(&addr,&pnode->addr);
  bVar1 = CNetAddr::IsRoutable((CNetAddr *)&addr);
  if (bVar1) {
    bVar1 = IsProxy((CNetAddr *)&addr);
    if (!bVar1) {
      bVar1 = CNetAddr::IsAddrV1Compatible((CNetAddr *)&addr);
      if (bVar1) {
        CService::CService(&addr_you,&addr.super_CService);
        goto LAB_001aef43;
      }
    }
  }
  CService::CService(&addr_you);
LAB_001aef43:
  your_services = addr.nServices;
  bVar1 = RejectIncomingTxs(this,pnode);
  tx_relay = !bVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"version",&local_16a);
  local_180 = &CNetAddr::V1;
  local_178 = &addr_you;
  args_7 = (unsigned_long *)0x1aefa0;
  CService::CService(&local_138);
  this_00 = this->m_connman;
  local_90 = local_80;
  if (local_110 == local_100) {
    uStack_78 = uStack_f8;
  }
  else {
    local_90 = local_110;
  }
  local_88 = local_108;
  local_108 = 0;
  local_100[0] = 0;
  msg_type._M_string_length = (size_type)&my_services;
  msg_type._M_dataplus._M_p = (pointer)&local_180;
  msg_type.field_2._M_allocated_capacity._0_4_ = (int)&stack0xfffffffffffffe70;
  msg_type.field_2._M_allocated_capacity._4_4_ = (int)((ulong)&stack0xfffffffffffffe70 >> 0x20);
  msg_type.field_2._8_8_ = &nonce;
  local_110 = local_100;
  NetMsg::
  Make<int_const&,unsigned_long&,long_const&,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,std::__cxx11::string&,int_const&,bool_const&>
            (&local_70,(NetMsg *)&local_90,msg_type,&PROTOCOL_VERSION,&my_services,&nTime,
             &your_services,
             (ParamsWrapper<CNetAddr::SerParams,_CService> *)&strSubVersion_abi_cxx11_,
             (unsigned_long *)&nNodeStartingHeight,
             (ParamsWrapper<CNetAddr::SerParams,_CService> *)&tx_relay,args_7,
             in_stack_fffffffffffffe68,(int *)&CNetAddr::V1,(bool *)&local_138);
  CConnman::PushMessage(this_00,pnode,&local_70);
  level = (Level)pnode;
  CSerializedNetMsg::~CSerializedNetMsg(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_138);
  std::__cxx11::string::~string((string *)&local_110);
  if (fLogIPs == true) {
    bVar1 = ::LogAcceptCategory(NET,level);
    if (bVar1) {
      CService::ToStringAddrPort_abi_cxx11_((string *)&local_70,&addr_you);
      logging_function._M_str = "PushNodeVersion";
      logging_function._M_len = 0xf;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file._M_len = 0x62;
      LogPrintFormatInternal<int,int,std::__cxx11::string,bool,long>
                (logging_function,source_file,0x68a,NET,Debug,(ConstevalFormatString<5U>)0x68ae48,
                 &PROTOCOL_VERSION,&nNodeStartingHeight,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                 &tx_relay,&nodeid);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  else {
    bVar1 = ::LogAcceptCategory(NET,level);
    if (bVar1) {
      logging_function_00._M_str = "PushNodeVersion";
      logging_function_00._M_len = 0xf;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file_00._M_len = 0x62;
      LogPrintFormatInternal<int,int,bool,long>
                (logging_function_00,source_file_00,0x68c,NET,Debug,
                 (ConstevalFormatString<4U>)0x68ae93,&PROTOCOL_VERSION,&nNodeStartingHeight,
                 &tx_relay,&nodeid);
    }
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_you);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::PushNodeVersion(CNode& pnode, const Peer& peer)
{
    uint64_t my_services{peer.m_our_services};
    const int64_t nTime{count_seconds(GetTime<std::chrono::seconds>())};
    uint64_t nonce = pnode.GetLocalNonce();
    const int nNodeStartingHeight{m_best_height};
    NodeId nodeid = pnode.GetId();
    CAddress addr = pnode.addr;

    CService addr_you = addr.IsRoutable() && !IsProxy(addr) && addr.IsAddrV1Compatible() ? addr : CService();
    uint64_t your_services{addr.nServices};

    const bool tx_relay{!RejectIncomingTxs(pnode)};
    MakeAndPushMessage(pnode, NetMsgType::VERSION, PROTOCOL_VERSION, my_services, nTime,
            your_services, CNetAddr::V1(addr_you), // Together the pre-version-31402 serialization of CAddress "addrYou" (without nTime)
            my_services, CNetAddr::V1(CService{}), // Together the pre-version-31402 serialization of CAddress "addrMe" (without nTime)
            nonce, strSubVersion, nNodeStartingHeight, tx_relay);

    if (fLogIPs) {
        LogDebug(BCLog::NET, "send version message: version %d, blocks=%d, them=%s, txrelay=%d, peer=%d\n", PROTOCOL_VERSION, nNodeStartingHeight, addr_you.ToStringAddrPort(), tx_relay, nodeid);
    } else {
        LogDebug(BCLog::NET, "send version message: version %d, blocks=%d, txrelay=%d, peer=%d\n", PROTOCOL_VERSION, nNodeStartingHeight, tx_relay, nodeid);
    }
}